

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

void BinarySink_put_ber_id_len(BinarySink *bs,int id,int length,int flags)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  
  BinarySink_put_byte(bs->binarysink_,(byte)id | (byte)flags);
  if (length < 0x80) {
    BinarySink_put_byte(bs->binarysink_,(uchar)length);
    return;
  }
  bVar3 = 0xf8;
  iVar2 = 0;
  do {
    bVar1 = bVar3 + 0x10;
    bVar3 = bVar3 + 8;
    iVar2 = iVar2 + -1;
  } while (0 < (int)((uint)length >> (bVar1 & 0x1f)));
  BinarySink_put_byte(bs->binarysink_,-(char)iVar2 | 0x80);
  do {
    BinarySink_put_byte(bs->binarysink_,(uchar)((uint)length >> (bVar3 & 0x1f)));
    bVar3 = bVar3 - 8;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void BinarySink_put_ber_id_len(BinarySink *bs,
                                      int id, int length, int flags)
{
    if (id <= 30) {
        /*
         * Identifier is one byte.
         */
        put_byte(bs, id | flags);
    } else {
        int n;
        /*
         * Identifier is multiple bytes: the first byte is 11111
         * plus the flags, and subsequent bytes encode the value of
         * the identifier, 7 bits at a time, with the top bit of
         * each byte 1 except the last one which is 0.
         */
        put_byte(bs, 0x1F | flags);
        for (n = 1; (id >> (7*n)) > 0; n++)
            continue;                  /* count the bytes */
        while (n--)
            put_byte(bs, (n ? 0x80 : 0) | ((id >> (7*n)) & 0x7F));
    }

    if (length < 128) {
        /*
         * Length is one byte.
         */
        put_byte(bs, length);
    } else {
        int n;
        /*
         * Length is multiple bytes. The first is 0x80 plus the
         * number of subsequent bytes, and the subsequent bytes
         * encode the actual length.
         */
        for (n = 1; (length >> (8*n)) > 0; n++)
            continue;                  /* count the bytes */
        put_byte(bs, 0x80 | n);
        while (n--)
            put_byte(bs, (length >> (8*n)) & 0xFF);
    }
}